

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O0

void send_recv_start(void)

{
  int iVar1;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  
  iVar1 = uv_is_readable(0x34ad10);
  if ((long)iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc-send-recv.c"
            ,0x166,"1","==","uv_is_readable((uv_stream_t*)&ctx2.channel)",1,"==",(long)iVar1);
    abort();
  }
  iVar1 = uv_is_writable(0x34ad10);
  if ((long)iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc-send-recv.c"
            ,0x167,"1","==","uv_is_writable((uv_stream_t*)&ctx2.channel)",1,"==",(long)iVar1);
    abort();
  }
  iVar1 = uv_is_closing(0x34ad10);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc-send-recv.c"
            ,0x168,"uv_is_closing((uv_handle_t*)&ctx2.channel)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_read_start(0x34ad10,alloc_cb,read_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc-send-recv.c"
            ,0x16b,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  return;
}

Assistant:

static void send_recv_start(void) {
  int r;
  ASSERT_EQ(1, uv_is_readable((uv_stream_t*)&ctx2.channel));
  ASSERT_EQ(1, uv_is_writable((uv_stream_t*)&ctx2.channel));
  ASSERT_OK(uv_is_closing((uv_handle_t*)&ctx2.channel));

  r = uv_read_start((uv_stream_t*)&ctx2.channel, alloc_cb, read_cb);
  ASSERT_OK(r);
}